

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mac.c
# Opt level: O0

int mac_method_hmac_sha2_512_hash
              (LIBSSH2_SESSION *session,uchar *buf,uint32_t seqno,uchar *packet,size_t packet_len,
              uchar *addtl,size_t addtl_len,void **abstract)

{
  void *key;
  HMAC_CTX *ctx_00;
  EVP_MD *md;
  uchar local_44 [4];
  HMAC_CTX *pHStack_40;
  uchar seqno_buf [4];
  HMAC_CTX *ctx;
  uchar *addtl_local;
  size_t packet_len_local;
  uchar *packet_local;
  uint32_t seqno_local;
  uchar *buf_local;
  LIBSSH2_SESSION *session_local;
  
  _libssh2_htonu32(local_44,seqno);
  ctx_00 = (HMAC_CTX *)HMAC_CTX_new();
  key = *abstract;
  pHStack_40 = ctx_00;
  md = EVP_sha512();
  HMAC_Init_ex(ctx_00,key,0x40,md,(ENGINE *)0x0);
  HMAC_Update(pHStack_40,local_44,4);
  HMAC_Update(pHStack_40,packet,packet_len);
  if ((addtl != (uchar *)0x0) && (addtl_len != 0)) {
    HMAC_Update(pHStack_40,addtl,addtl_len);
  }
  HMAC_Final(pHStack_40,buf,(uint *)0x0);
  HMAC_CTX_free(pHStack_40);
  return 0;
}

Assistant:

static int
mac_method_hmac_sha2_512_hash(LIBSSH2_SESSION * session,
                              unsigned char *buf, uint32_t seqno,
                              const unsigned char *packet,
                              size_t packet_len,
                              const unsigned char *addtl,
                              size_t addtl_len, void **abstract)
{
    libssh2_hmac_ctx ctx;
    unsigned char seqno_buf[4];
    (void)session;

    _libssh2_htonu32(seqno_buf, seqno);

    libssh2_hmac_ctx_init(ctx);
    libssh2_hmac_sha512_init(&ctx, *abstract, 64);
    libssh2_hmac_update(ctx, seqno_buf, 4);
    libssh2_hmac_update(ctx, packet, packet_len);
    if(addtl && addtl_len) {
        libssh2_hmac_update(ctx, addtl, addtl_len);
    }
    libssh2_hmac_final(ctx, buf);
    libssh2_hmac_cleanup(&ctx);

    return 0;
}